

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O1

FILE * js_std_file_get(JSContext *ctx,JSValue obj)

{
  long *plVar1;
  FILE *pFVar2;
  
  plVar1 = (long *)JS_GetOpaque2(ctx,obj,js_std_file_class_id);
  if (plVar1 == (long *)0x0) {
    pFVar2 = (FILE *)0x0;
  }
  else {
    pFVar2 = (FILE *)*plVar1;
    if (pFVar2 == (FILE *)0x0) {
      pFVar2 = (FILE *)0x0;
      JS_ThrowTypeError(ctx,"invalid file handle");
    }
  }
  return pFVar2;
}

Assistant:

static FILE *js_std_file_get(JSContext *ctx, JSValueConst obj)
{
    JSSTDFile *s = JS_GetOpaque2(ctx, obj, js_std_file_class_id);
    if (!s)
        return NULL;
    if (!s->f) {
        JS_ThrowTypeError(ctx, "invalid file handle");
        return NULL;
    }
    return s->f;
}